

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_export.c
# Opt level: O0

REF_STATUS ref_export_cell_id_range(REF_CELL ref_cell,REF_INT *min_faceid,REF_INT *max_faceid)

{
  REF_STATUS RVar1;
  REF_INT local_a0;
  REF_INT local_9c;
  REF_INT local_98 [2];
  REF_INT nodes [27];
  int local_24;
  REF_INT cell;
  REF_INT *max_faceid_local;
  REF_INT *min_faceid_local;
  REF_CELL ref_cell_local;
  
  *min_faceid = 0x7fffffff;
  *max_faceid = -0x80000000;
  for (local_24 = 0; local_24 < ref_cell->max; local_24 = local_24 + 1) {
    RVar1 = ref_cell_nodes(ref_cell,local_24,local_98);
    if (RVar1 == 0) {
      if (*min_faceid < nodes[(long)ref_cell->node_per + -2]) {
        local_9c = *min_faceid;
      }
      else {
        local_9c = nodes[(long)ref_cell->node_per + -2];
      }
      *min_faceid = local_9c;
      if (nodes[(long)ref_cell->node_per + -2] < *max_faceid) {
        local_a0 = *max_faceid;
      }
      else {
        local_a0 = nodes[(long)ref_cell->node_per + -2];
      }
      *max_faceid = local_a0;
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_export_cell_id_range(REF_CELL ref_cell,
                                                   REF_INT *min_faceid,
                                                   REF_INT *max_faceid) {
  REF_INT cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];

  *min_faceid = REF_INT_MAX;
  *max_faceid = REF_INT_MIN;

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    *min_faceid = MIN(*min_faceid, nodes[ref_cell_id_index(ref_cell)]);
    *max_faceid = MAX(*max_faceid, nodes[ref_cell_id_index(ref_cell)]);
  }

  return REF_SUCCESS;
}